

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PauliX.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::PauliX<std::complex<double>_>::matrix(PauliX<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  data_type extraout_RDX;
  SquareMatrix<std::complex<double>_> SVar2;
  
  (this->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)0x2;
  puVar1 = (undefined8 *)operator_new__(0x40);
  *(undefined8 **)&(this->super_QGate1<std::complex<double>_>).qubit_ = puVar1;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0x3ff0000000000000;
  puVar1[3] = 0;
  puVar1[4] = 0x3ff0000000000000;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 0 , 1 ,
                                                  1 , 0 ) ;
        }